

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

void __thiscall MeshLib::Solid::readBYU(Solid *this,istream *is)

{
  double dVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  string_token_iterator *psVar6;
  char *pcVar7;
  long *plVar8;
  size_t sVar9;
  double *pdVar10;
  Point *pPVar11;
  int *piVar12;
  bool local_a12;
  string_token_iterator local_9e0;
  string local_9c0;
  int local_9a0;
  int local_99c;
  int i_1;
  int v_1 [3];
  tVertex v;
  string local_968;
  int local_944;
  undefined1 auStack_940 [4];
  int i;
  Point p;
  string str_1;
  string_token_iterator iter_1;
  undefined1 local_8e0 [8];
  string s_1;
  int find;
  int vind;
  int local_894;
  undefined1 local_890 [4];
  int vnum;
  string str;
  string_token_iterator iter;
  allocator local_839;
  undefined1 local_838 [8];
  string s;
  char line [2048];
  istream *is_local;
  Solid *this_local;
  
  std::istream::getline((char *)is,(long)(s.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_838,s.field_2._M_local_buf + 8,&local_839);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  string_token_iterator::string_token_iterator
            ((string_token_iterator *)((long)&str.field_2 + 8),(string *)local_838," \n");
  psVar6 = string_token_iterator::operator++((string_token_iterator *)((long)&str.field_2 + 8));
  string_token_iterator::operator*[abi_cxx11_((string *)local_890,psVar6);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  local_894 = atoi(pcVar7);
  psVar6 = string_token_iterator::operator++((string_token_iterator *)((long)&str.field_2 + 8));
  string_token_iterator::operator*[abi_cxx11_((string *)&find,psVar6);
  std::__cxx11::string::operator=((string *)local_890,(string *)&find);
  std::__cxx11::string::~string((string *)&find);
  std::istream::getline((char *)is,(long)((long)&s.field_2 + 8));
  s_1.field_2._8_4_ = 1;
  s_1.field_2._12_4_ = 1;
  while( true ) {
    bVar3 = std::ios::operator_cast_to_bool((ios *)(is + *(long *)(*(long *)is + -0x18)));
    local_a12 = false;
    if (bVar3) {
      bVar4 = std::ios::eof();
      local_a12 = false;
      if ((bVar4 & 1) == 0) {
        plVar8 = (long *)std::istream::getline((char *)is,(long)((long)&s.field_2 + 8));
        local_a12 = std::ios::operator_cast_to_bool
                              ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
      }
    }
    if (local_a12 == false) break;
    sVar9 = strlen(s.field_2._M_local_buf + 8);
    if (sVar9 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_8e0,s.field_2._M_local_buf + 8,(allocator *)((long)&iter_1.end + 7)
                );
      std::allocator<char>::~allocator((allocator<char> *)((long)&iter_1.end + 7));
      string_token_iterator::string_token_iterator
                ((string_token_iterator *)((long)&str_1.field_2 + 8),(string *)local_8e0," \n");
      std::__cxx11::string::string((string *)(p.v + 2));
      if (local_894 < (int)s_1.field_2._12_4_) {
        for (local_9a0 = 0; local_9a0 < 3; local_9a0 = local_9a0 + 1) {
          string_token_iterator::operator*[abi_cxx11_
                    (&local_9c0,(string_token_iterator *)((long)&str_1.field_2 + 8));
          std::__cxx11::string::operator=((string *)(p.v + 2),(string *)&local_9c0);
          std::__cxx11::string::~string((string *)&local_9c0);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          iVar5 = atoi(pcVar7);
          (&local_99c)[local_9a0] = iVar5;
          string_token_iterator::operator++
                    (&local_9e0,(string_token_iterator *)((long)&str_1.field_2 + 8),0);
        }
        v_1[0] = -v_1[0];
        createFace(this,&local_99c,s_1.field_2._8_4_);
        s_1.field_2._8_4_ = s_1.field_2._8_4_ + 1;
      }
      else {
        Point::Point((Point *)auStack_940);
        for (local_944 = 0; local_944 < 3; local_944 = local_944 + 1) {
          string_token_iterator::operator*[abi_cxx11_
                    (&local_968,(string_token_iterator *)((long)&str_1.field_2 + 8));
          std::__cxx11::string::operator=((string *)(p.v + 2),(string *)&local_968);
          std::__cxx11::string::~string((string *)&local_968);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          dVar1 = atof(pcVar7);
          pdVar10 = Point::operator[]((Point *)auStack_940,local_944);
          *pdVar10 = dVar1;
          string_token_iterator::operator++
                    ((string_token_iterator *)&v,(string_token_iterator *)((long)&str_1.field_2 + 8)
                     ,0);
        }
        v_1._4_8_ = createVertex(this,s_1.field_2._12_4_);
        pPVar11 = Vertex::point((Vertex *)v_1._4_8_);
        uVar2 = s_1.field_2._12_4_;
        pPVar11->v[2] = p.v[1];
        pPVar11->v[0] = _auStack_940;
        pPVar11->v[1] = p.v[0];
        piVar12 = Vertex::id((Vertex *)v_1._4_8_);
        *piVar12 = uVar2;
        s_1.field_2._12_4_ = s_1.field_2._12_4_ + 1;
        Point::~Point((Point *)auStack_940);
      }
      std::__cxx11::string::~string((string *)(p.v + 2));
      std::__cxx11::string::~string((string *)local_8e0);
    }
  }
  labelBoundaryEdges(this);
  removeDanglingVertices(this);
  std::__cxx11::string::~string((string *)local_890);
  std::__cxx11::string::~string((string *)local_838);
  return;
}

Assistant:

void Solid::readBYU( std::istream & is )
{
	char line[MAX_LINE];

	is.getline(line, MAX_LINE);
	std::string s(line );
	string_token_iterator iter(s, " \n");
	std::string str = *(++iter);
	int vnum = atoi( str.c_str() );
	str = *(++iter);
//	int fnum = atoi( str.c_str() );
	is.getline(line, MAX_LINE);
	int vind, find;
	vind = find = 1;

	while( is && !is.eof() && is.getline(line, MAX_LINE) )
	{		
		if( strlen( line ) == 0 ) continue;

		std::string s(line);

		string_token_iterator iter(s, " \n"); 
		std::string str;

		if( vind <= vnum )
		{
			Point p;
			for( int i=0; i<3; i++ )
			{
				str = *iter;
				p[i] = atof( str.c_str() );
				iter++;
			}

			tVertex v = createVertex( vind );
			v->point() = p;
			v->id() = vind;
			vind ++;
		}
		else
		{
			int v[3];
			for( int i = 0; i < 3; i ++ )
			{
				str = *iter;
				v[i] = atoi( str.c_str() );
				iter++;
			}
			v[2] = -v[2];

			createFace( v, find );
			find ++;
		}
	}

	labelBoundaryEdges();

	removeDanglingVertices();

}